

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O1

size_t masked_vbyte_read_loop_fromcompressedsize(uint8_t *in,uint32_t *out,size_t inputsize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t ints_read;
  uint64_t local_50;
  uint32_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = out;
  if (inputsize < 0x61) {
    uVar13 = 0;
    uVar9 = 0;
    uVar8 = 0;
  }
  else {
    auVar2 = *(undefined1 (*) [32])in;
    auVar1 = *(undefined1 (*) [16])(in + 0x20);
    uVar9 = 0;
    uVar8 = 0;
    uVar5 = (ulong)CONCAT24((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar1[0xf] >> 7) << 0xf,
                            (uint)(SUB321(auVar2 >> 7,0) & 1) |
                            (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                            (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                            (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                            (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                            (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                            (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                            (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                            (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                            (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                            (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                            (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                            (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                            (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                            (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                            (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                            (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                            (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                            (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                            (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                            (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                            (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                            (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                            (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                            (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                            (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                            (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                            (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                            (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                            (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                            (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                            (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
    uVar13 = 0x30;
    do {
      uVar10 = uVar13 + 0x30;
      if (inputsize < uVar10) {
        uVar11 = (int)uVar13 - (int)uVar8;
        uVar13 = (ulong)uVar11;
        uVar9 = uVar9 | uVar5 << ((ulong)(uVar11 - 0x30) & 0x3f);
        goto LAB_001433c2;
      }
      auVar2 = *(undefined1 (*) [32])(in + uVar13);
      auVar1 = *(undefined1 (*) [16])(in + uVar13 + 0x20);
      local_40 = (ulong)CONCAT24((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar1[0xf] >> 7) << 0xf,
                                 (uint)(SUB321(auVar2 >> 7,0) & 1) |
                                 (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                 (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                 (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                 (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                 (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                 (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                 (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                 (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                 (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                 (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                 (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                 (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                 (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                 (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                 (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                 (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                 (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                 (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                 (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                 (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                 (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                 (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                 (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                 (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                 (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                 (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                 (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                 (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                 (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                 (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                 (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f);
      uVar9 = uVar9 | uVar5 << ((ulong)(byte)(((char)uVar13 - (char)uVar8) - 0x30) & 0x3f);
      uVar12 = uVar13 - 0x10;
      local_38 = uVar10;
      do {
        uVar10 = uVar8;
        uVar8 = uVar10;
        if (uVar12 <= uVar10) break;
        uVar6 = masked_vbyte_read_group(in + uVar10,out,uVar9,&local_50);
        uVar9 = uVar9 >> (uVar6 & 0x3f);
        if (uVar9 == 0xffffffffffffffff) {
          uVar6 = 0;
        }
        uVar8 = uVar6 + uVar10;
        uVar6 = 0;
        if (uVar9 != 0xffffffffffffffff) {
          uVar6 = local_50;
        }
        out = out + uVar6;
      } while (uVar9 != 0xffffffffffffffff);
      uVar5 = local_40;
      uVar13 = local_38;
    } while (uVar12 <= uVar10);
    uVar13 = 0;
    uVar10 = local_38;
LAB_001433c2:
    if (uVar10 <= inputsize) {
      return 0;
    }
  }
  do {
    uVar11 = (uint)uVar13;
    if ((int)uVar11 < 0x10) {
      lVar7 = (long)(int)uVar11;
      if (uVar8 + 0x1f + lVar7 < inputsize) {
        auVar2 = *(undefined1 (*) [32])(in + uVar8 + lVar7);
        uVar9 = uVar9 | (ulong)((uint)(SUB321(auVar2 >> 7,0) & 1) |
                                (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f) << (uVar13 & 0x3f);
        uVar11 = uVar11 + 0x20;
      }
      else {
        if (inputsize <= uVar8 + lVar7 + 0xf) {
          if (uVar8 < inputsize) {
            iVar4 = 0;
            uVar11 = 0;
            do {
              while( true ) {
                uVar9 = uVar8 + 1;
                bVar3 = in[uVar8];
                if ((char)bVar3 < '\0') {
                  iVar4 = iVar4 + ((bVar3 & 0x7f) << (uVar11 & 0x1f));
                }
                else {
                  *out = ((uint)bVar3 << (uVar11 & 0x1f)) + iVar4;
                  out = out + 1;
                }
                uVar8 = uVar9;
                if ((-1 < (char)bVar3) || (inputsize <= uVar9)) break;
                uVar11 = uVar11 + 7;
              }
              iVar4 = 0;
              uVar11 = 0;
            } while (uVar9 < inputsize);
          }
          return (long)out - (long)local_48 >> 2;
        }
        auVar1 = vlddqu_avx(*(undefined1 (*) [16])(in + uVar8 + lVar7));
        uVar9 = uVar9 | (long)(int)((uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                                   (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                                   (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                                   (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                                   (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                                   (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                                   (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                                   (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                                   (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                                   (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                                   (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                                   (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                                   (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                                   (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                                   (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                                  (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) <<
                                   (uVar11 & 0x1f));
        uVar11 = uVar11 + 0x10;
      }
    }
    uVar6 = masked_vbyte_read_group(in + uVar8,out,uVar9,&local_50);
    uVar8 = uVar8 + uVar6;
    uVar13 = (ulong)(uVar11 - (int)uVar6);
    uVar9 = uVar9 >> (uVar6 & 0x3f);
    out = out + local_50;
  } while( true );
}

Assistant:

size_t masked_vbyte_read_loop_fromcompressedsize(const uint8_t *in,
                                                 uint32_t *out,
                                                 size_t inputsize) {
  size_t consumed = 0; // number of bytes read
  uint32_t *initout = out;

  uint64_t sig = 0;
  int availablebytes = 0;
  if (96 < inputsize) {
    size_t scanned = 0;

#ifdef __AVX2__
    __m256i low = _mm256_loadu_si256((__m256i *)(in + scanned));
    uint32_t lowSig = _mm256_movemask_epi8(low);
#else
    __m128i low1 = _mm_loadu_si128((__m128i *)(in + scanned));
    uint32_t lowSig1 = _mm_movemask_epi8(low1);
    __m128i low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
    uint32_t lowSig2 = _mm_movemask_epi8(low2);
    uint32_t lowSig = lowSig2 << 16;
    lowSig |= lowSig1;
#endif

    // excess verbosity to avoid problems with sign extension on conversions
    // better to think about what's happening and make it clearer
    __m128i high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
    uint32_t highSig = _mm_movemask_epi8(high);
    uint64_t nextSig = highSig;
    nextSig <<= 32;
    nextSig |= lowSig;
    scanned += 48;

    while (scanned + 48 <= inputsize) { // 96 == 48 + 48 ahead for scanning
      uint64_t thisSig = nextSig;

#ifdef __AVX2__
      low = _mm256_loadu_si256((__m256i *)(in + scanned));
      lowSig = _mm256_movemask_epi8(low);
#else
      low1 = _mm_loadu_si128((__m128i *)(in + scanned));
      lowSig1 = _mm_movemask_epi8(low1);
      low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
      lowSig2 = _mm_movemask_epi8(low2);
      lowSig = lowSig2 << 16;
      lowSig |= lowSig1;
#endif

      high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
      highSig = _mm_movemask_epi8(high);
      nextSig = highSig;
      nextSig <<= 32;
      nextSig |= lowSig;

      uint64_t remaining = scanned - (consumed + 48);
      sig = (thisSig << remaining) | sig;

      uint64_t reload = scanned - 16;
      scanned += 48;

      // need to reload when less than 16 scanned bytes remain in sig
      while (consumed < reload) {
        uint64_t ints_read;
        uint64_t bytes =
            masked_vbyte_read_group(in + consumed, out, sig, &ints_read);
        sig >>= bytes;

        // seems like this might force the compiler to prioritize shifting sig
        // >>= bytes
        if (sig == 0xFFFFFFFFFFFFFFFF)
          return 0; // fake check to force earliest evaluation

        consumed += bytes;
        out += ints_read;
      }
    }
    sig = (nextSig << (scanned - consumed - 48)) | sig;
    availablebytes = (int)(scanned - consumed);
  }
  while (1) {
    if (availablebytes < 16) {
      if (availablebytes + consumed + 31 < inputsize) {
#ifdef __AVX2__
        uint64_t newsigavx = (uint32_t)_mm256_movemask_epi8(
            _mm256_loadu_si256((__m256i *)(in + availablebytes + consumed)));
        sig |= (newsigavx << availablebytes);
#else
        uint64_t newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        uint64_t newsig2 = _mm_movemask_epi8(_mm_lddqu_si128(
            (const __m128i *)(in + availablebytes + 16 + consumed)));
        sig |= (newsig << availablebytes) | (newsig2 << (availablebytes + 16));
#endif
        availablebytes += 32;
      } else if (availablebytes + consumed + 15 < inputsize) {
        int newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        sig |= newsig << availablebytes;
        availablebytes += 16;
      } else {
        break;
      }
    }
    uint64_t ints_read;
    uint64_t bytes =
        masked_vbyte_read_group(in + consumed, out, sig, &ints_read);
    consumed += bytes;
    availablebytes -= bytes;
    sig >>= bytes;
    out += ints_read;
  }
  while (consumed < inputsize) {
    unsigned int shift = 0;
    for (uint32_t v = 0; consumed < inputsize; shift += 7) {
      uint8_t c = in[consumed++];
      if ((c & 128) == 0) {
        out[0] = v + (c << shift);
        ++out;
        break;
      } else {
        v += (c & 127) << shift;
      }
    }
  }
  return out - initout;
}